

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::TanH_x86_avx::forward_inplace(TanH_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  float *pfVar9;
  long lVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar15 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  
  iVar1 = bottom_top_blob->c;
  if (0 < (long)iVar1) {
    uVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    lVar8 = 0;
    do {
      auVar36._8_4_ = 0x3f800000;
      auVar36._0_8_ = 0x3f8000003f800000;
      auVar30._8_4_ = 0xc2b0c0a5;
      auVar30._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar25._8_4_ = 0x42b0c0a5;
      auVar25._0_8_ = 0x42b0c0a542b0c0a5;
      auVar36._12_4_ = 0x3f800000;
      auVar30._12_4_ = 0xc2b0c0a5;
      auVar25._12_4_ = 0x42b0c0a5;
      auVar36._16_4_ = 0x3f800000;
      auVar30._16_4_ = 0xc2b0c0a5;
      auVar25._16_4_ = 0x42b0c0a5;
      auVar36._20_4_ = 0x3f800000;
      auVar30._20_4_ = 0xc2b0c0a5;
      auVar25._20_4_ = 0x42b0c0a5;
      auVar36._24_4_ = 0x3f800000;
      auVar30._24_4_ = 0xc2b0c0a5;
      auVar25._24_4_ = 0x42b0c0a5;
      auVar36._28_4_ = 0x3f800000;
      auVar30._28_4_ = 0xc2b0c0a5;
      auVar25._28_4_ = 0x42b0c0a5;
      pfVar9 = (float *)(bottom_top_blob->cstep * lVar8 * bottom_top_blob->elemsize +
                        (long)bottom_top_blob->data);
      if ((int)uVar7 < 8) {
        uVar5 = 0;
      }
      else {
        iVar4 = 7;
        do {
          auVar3._4_4_ = pfVar9[1] * -2.0;
          auVar3._0_4_ = *pfVar9 * -2.0;
          auVar3._8_4_ = pfVar9[2] * -2.0;
          auVar3._12_4_ = pfVar9[3] * -2.0;
          auVar3._16_4_ = pfVar9[4] * -2.0;
          auVar3._20_4_ = pfVar9[5] * -2.0;
          auVar3._24_4_ = pfVar9[6] * -2.0;
          auVar3._28_4_ = 0xc0000000;
          auVar3 = vminps_avx(auVar3,auVar25);
          auVar2 = vmaxps_avx(auVar3,auVar30);
          auVar26._0_4_ = auVar2._0_4_ * 1.442695 + 0.5;
          auVar26._4_4_ = auVar2._4_4_ * 1.442695 + 0.5;
          auVar26._8_4_ = auVar2._8_4_ * 1.442695 + 0.5;
          auVar26._12_4_ = auVar2._12_4_ * 1.442695 + 0.5;
          auVar26._16_4_ = auVar2._16_4_ * 1.442695 + 0.5;
          auVar26._20_4_ = auVar2._20_4_ * 1.442695 + 0.5;
          auVar26._24_4_ = auVar2._24_4_ * 1.442695 + 0.5;
          auVar26._28_4_ = 0x42b1c0a5;
          auVar32 = vroundps_avx(auVar26,1);
          auVar3 = vcmpps_avx(auVar26,auVar32,1);
          auVar3 = vandps_avx(auVar36,auVar3);
          auVar3 = vsubps_avx(auVar32,auVar3);
          fVar11 = auVar2._0_4_ + auVar3._0_4_ * -0.6931472;
          fVar16 = auVar2._4_4_ + auVar3._4_4_ * -0.6931472;
          fVar17 = auVar2._8_4_ + auVar3._8_4_ * -0.6931472;
          fVar18 = auVar2._12_4_ + auVar3._12_4_ * -0.6931472;
          fVar19 = auVar2._16_4_ + auVar3._16_4_ * -0.6931472;
          fVar20 = auVar2._20_4_ + auVar3._20_4_ * -0.6931472;
          fVar21 = auVar2._24_4_ + auVar3._24_4_ * -0.6931472;
          auVar22._0_4_ = (int)auVar3._0_4_;
          auVar22._4_4_ = (int)auVar3._4_4_;
          auVar22._8_4_ = (int)auVar3._8_4_;
          auVar22._12_4_ = (int)auVar3._12_4_;
          auVar27._16_4_ = (int)auVar3._16_4_;
          auVar27._0_16_ = auVar22;
          auVar27._20_4_ = (int)auVar3._20_4_;
          auVar27._24_4_ = (int)auVar3._24_4_;
          auVar27._28_4_ = (int)auVar3._28_4_;
          auVar28 = vpslld_avx(auVar22,0x17);
          auVar22 = vpslld_avx(auVar27._16_16_,0x17);
          auVar31._8_4_ = 0x3f800000;
          auVar31._0_8_ = 0x3f8000003f800000;
          auVar31._12_4_ = 0x3f800000;
          auVar22 = vpaddd_avx(auVar22,auVar31);
          auVar28 = vpaddd_avx(auVar28,auVar31);
          auVar15._0_4_ =
               (fVar11 + 1.0 +
               fVar11 * fVar11 *
               (((((fVar11 * 0.00019875691 + 0.0013981999) * fVar11 + 0.008333452) * fVar11 +
                 0.041665796) * fVar11 + 0.16666666) * fVar11 + 0.5)) * auVar28._0_4_ + 1.0;
          auVar15._4_4_ =
               (fVar16 + 1.0 +
               fVar16 * fVar16 *
               (((((fVar16 * 0.00019875691 + 0.0013981999) * fVar16 + 0.008333452) * fVar16 +
                 0.041665796) * fVar16 + 0.16666666) * fVar16 + 0.5)) * auVar28._4_4_ + 1.0;
          auVar15._8_4_ =
               (fVar17 + 1.0 +
               fVar17 * fVar17 *
               (((((fVar17 * 0.00019875691 + 0.0013981999) * fVar17 + 0.008333452) * fVar17 +
                 0.041665796) * fVar17 + 0.16666666) * fVar17 + 0.5)) * auVar28._8_4_ + 1.0;
          auVar15._12_4_ =
               (fVar18 + 1.0 +
               fVar18 * fVar18 *
               (((((fVar18 * 0.00019875691 + 0.0013981999) * fVar18 + 0.008333452) * fVar18 +
                 0.041665796) * fVar18 + 0.16666666) * fVar18 + 0.5)) * auVar28._12_4_ + 1.0;
          auVar15._16_4_ =
               (fVar19 + 1.0 +
               fVar19 * fVar19 *
               (((((fVar19 * 0.00019875691 + 0.0013981999) * fVar19 + 0.008333452) * fVar19 +
                 0.041665796) * fVar19 + 0.16666666) * fVar19 + 0.5)) * auVar22._0_4_ + 1.0;
          auVar15._20_4_ =
               (fVar20 + 1.0 +
               fVar20 * fVar20 *
               (((((fVar20 * 0.00019875691 + 0.0013981999) * fVar20 + 0.008333452) * fVar20 +
                 0.041665796) * fVar20 + 0.16666666) * fVar20 + 0.5)) * auVar22._4_4_ + 1.0;
          auVar15._24_4_ =
               (fVar21 + 1.0 +
               fVar21 * fVar21 *
               (((((fVar21 * 0.00019875691 + 0.0013981999) * fVar21 + 0.008333452) * fVar21 +
                 0.041665796) * fVar21 + 0.16666666) * fVar21 + 0.5)) * auVar22._8_4_ + 1.0;
          auVar15._28_4_ = auVar2._28_4_ + auVar32._28_4_ + 1.0 + auVar32._28_4_ + 1.0;
          auVar3 = vrcpps_avx(auVar15);
          fVar11 = auVar3._0_4_;
          fVar16 = auVar3._4_4_;
          fVar17 = auVar3._8_4_;
          fVar18 = auVar3._12_4_;
          fVar19 = auVar3._16_4_;
          fVar20 = auVar3._20_4_;
          fVar21 = auVar3._24_4_;
          auVar2._4_4_ = auVar15._4_4_ * (fVar16 + fVar16);
          auVar2._0_4_ = auVar15._0_4_ * (fVar11 + fVar11);
          auVar2._8_4_ = auVar15._8_4_ * (fVar17 + fVar17);
          auVar2._12_4_ = auVar15._12_4_ * (fVar18 + fVar18);
          auVar2._16_4_ = auVar15._16_4_ * (fVar19 + fVar19);
          auVar2._20_4_ = auVar15._20_4_ * (fVar20 + fVar20);
          auVar2._24_4_ = auVar15._24_4_ * (fVar21 + fVar21);
          auVar2._28_4_ = auVar15._28_4_;
          auVar32._8_4_ = 0x40000000;
          auVar32._0_8_ = 0x4000000040000000;
          auVar32._12_4_ = 0x40000000;
          auVar32._16_4_ = 0x40000000;
          auVar32._20_4_ = 0x40000000;
          auVar32._24_4_ = 0x40000000;
          auVar32._28_4_ = 0x40000000;
          auVar2 = vsubps_avx(auVar32,auVar2);
          *pfVar9 = fVar11 + fVar11 + -1.0 + fVar11 * auVar2._0_4_;
          pfVar9[1] = fVar16 + fVar16 + -1.0 + fVar16 * auVar2._4_4_;
          pfVar9[2] = fVar17 + fVar17 + -1.0 + fVar17 * auVar2._8_4_;
          pfVar9[3] = fVar18 + fVar18 + -1.0 + fVar18 * auVar2._12_4_;
          pfVar9[4] = fVar19 + fVar19 + -1.0 + fVar19 * auVar2._16_4_;
          pfVar9[5] = fVar20 + fVar20 + -1.0 + fVar20 * auVar2._20_4_;
          pfVar9[6] = fVar21 + fVar21 + -1.0 + fVar21 * auVar2._24_4_;
          pfVar9[7] = auVar3._28_4_ + auVar3._28_4_ + -1.0 + auVar2._28_4_;
          pfVar9 = pfVar9 + 8;
          iVar4 = iVar4 + 8;
          uVar5 = uVar7 & 0xfffffff8;
        } while (iVar4 < (int)uVar7);
      }
      auVar28._8_4_ = 0x3f800000;
      auVar28._0_8_ = 0x3f8000003f800000;
      auVar28._12_4_ = 0x3f800000;
      auVar34._8_4_ = 0x42b0c0a5;
      auVar34._0_8_ = 0x42b0c0a542b0c0a5;
      auVar34._12_4_ = 0x42b0c0a5;
      auVar35._8_4_ = 0xc2b0c0a5;
      auVar35._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar35._12_4_ = 0xc2b0c0a5;
      auVar33._8_4_ = 0x40000000;
      auVar33._0_8_ = 0x4000000040000000;
      auVar33._12_4_ = 0x40000000;
      uVar6 = uVar5 | 3;
      while ((int)uVar6 < (int)uVar7) {
        auVar12._0_4_ = *pfVar9 * -2.0;
        auVar12._4_4_ = pfVar9[1] * -2.0;
        auVar12._8_4_ = pfVar9[2] * -2.0;
        auVar12._12_4_ = pfVar9[3] * -2.0;
        auVar22 = vminps_avx(auVar12,auVar34);
        auVar12 = vmaxps_avx(auVar22,auVar35);
        auVar23._0_4_ = auVar12._0_4_ * 1.442695 + 0.5;
        auVar23._4_4_ = auVar12._4_4_ * 1.442695 + 0.5;
        auVar23._8_4_ = auVar12._8_4_ * 1.442695 + 0.5;
        auVar23._12_4_ = auVar12._12_4_ * 1.442695 + 0.5;
        auVar29._0_4_ = (int)auVar23._0_4_;
        auVar29._4_4_ = (int)auVar23._4_4_;
        auVar29._8_4_ = (int)auVar23._8_4_;
        auVar29._12_4_ = (int)auVar23._12_4_;
        auVar31 = vcvtdq2ps_avx(auVar29);
        auVar22 = vcmpps_avx(auVar23,auVar31,1);
        auVar22 = vandps_avx(auVar22,auVar28);
        auVar22 = vsubps_avx(auVar31,auVar22);
        fVar11 = auVar12._0_4_ + auVar22._0_4_ * -0.6931472;
        fVar16 = auVar12._4_4_ + auVar22._4_4_ * -0.6931472;
        fVar17 = auVar12._8_4_ + auVar22._8_4_ * -0.6931472;
        fVar18 = auVar12._12_4_ + auVar22._12_4_ * -0.6931472;
        auVar24._0_4_ = (int)auVar22._0_4_;
        auVar24._4_4_ = (int)auVar22._4_4_;
        auVar24._8_4_ = (int)auVar22._8_4_;
        auVar24._12_4_ = (int)auVar22._12_4_;
        auVar22 = vpslld_avx(auVar24,0x17);
        auVar22 = vpaddd_avx(auVar22,auVar28);
        auVar13._0_4_ =
             (fVar11 + 1.0 +
             fVar11 * fVar11 *
             (((((fVar11 * 0.00019875691 + 0.0013981999) * fVar11 + 0.008333452) * fVar11 +
               0.041665796) * fVar11 + 0.16666666) * fVar11 + 0.5)) * auVar22._0_4_ + 1.0;
        auVar13._4_4_ =
             (fVar16 + 1.0 +
             fVar16 * fVar16 *
             (((((fVar16 * 0.00019875691 + 0.0013981999) * fVar16 + 0.008333452) * fVar16 +
               0.041665796) * fVar16 + 0.16666666) * fVar16 + 0.5)) * auVar22._4_4_ + 1.0;
        auVar13._8_4_ =
             (fVar17 + 1.0 +
             fVar17 * fVar17 *
             (((((fVar17 * 0.00019875691 + 0.0013981999) * fVar17 + 0.008333452) * fVar17 +
               0.041665796) * fVar17 + 0.16666666) * fVar17 + 0.5)) * auVar22._8_4_ + 1.0;
        auVar13._12_4_ =
             (fVar18 + 1.0 +
             fVar18 * fVar18 *
             (((((fVar18 * 0.00019875691 + 0.0013981999) * fVar18 + 0.008333452) * fVar18 +
               0.041665796) * fVar18 + 0.16666666) * fVar18 + 0.5)) * auVar22._12_4_ + 1.0;
        auVar22 = vrcpps_avx(auVar13);
        fVar11 = auVar22._0_4_;
        fVar16 = auVar22._4_4_;
        fVar17 = auVar22._8_4_;
        fVar18 = auVar22._12_4_;
        auVar14._0_4_ = auVar13._0_4_ * (fVar11 + fVar11);
        auVar14._4_4_ = auVar13._4_4_ * (fVar16 + fVar16);
        auVar14._8_4_ = auVar13._8_4_ * (fVar17 + fVar17);
        auVar14._12_4_ = auVar13._12_4_ * (fVar18 + fVar18);
        auVar22 = vsubps_avx(auVar33,auVar14);
        *pfVar9 = fVar11 + fVar11 + -1.0 + fVar11 * auVar22._0_4_;
        pfVar9[1] = fVar16 + fVar16 + -1.0 + fVar16 * auVar22._4_4_;
        pfVar9[2] = fVar17 + fVar17 + -1.0 + fVar17 * auVar22._8_4_;
        pfVar9[3] = fVar18 + fVar18 + -1.0 + fVar18 * auVar22._12_4_;
        pfVar9 = pfVar9 + 4;
        uVar6 = uVar5 + 7;
        uVar5 = uVar5 + 4;
      }
      if (uVar7 - uVar5 != 0 && (int)uVar5 <= (int)uVar7) {
        lVar10 = 0;
        do {
          fVar11 = tanhf(pfVar9[lVar10]);
          pfVar9[lVar10] = fVar11;
          lVar10 = lVar10 + 1;
        } while (uVar7 - uVar5 != (int)lVar10);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != iVar1);
  }
  return 0;
}

Assistant:

int TanH_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = tanh_avx512(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = tanh_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = tanh_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = tanh(*ptr);
            ptr++;
        }
    }

    return 0;
}